

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

int divsufsort(uchar *T,int *SA,int n,int openMP)

{
  byte bVar1;
  byte bVar2;
  void *__ptr;
  void *__ptr_00;
  int in_EDX;
  undefined4 *in_RSI;
  byte *in_RDI;
  int err;
  int m;
  int *bucket_B;
  int *bucket_A;
  int *in_stack_00000030;
  int *in_stack_00000038;
  uchar *in_stack_00000040;
  int local_38;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_38 = 0;
  if (((in_RDI == (byte *)0x0) || (in_RSI == (undefined4 *)0x0)) || (in_EDX < 0)) {
    local_38 = -1;
  }
  else if (in_EDX == 0) {
    local_38 = 0;
  }
  else if (in_EDX == 1) {
    *in_RSI = 0;
    local_38 = 0;
  }
  else if (in_EDX == 2) {
    bVar1 = *in_RDI;
    bVar2 = in_RDI[1];
    in_RSI[(int)(bVar1 < bVar2 ^ 1)] = 0;
    in_RSI[(int)(uint)(bVar1 < bVar2)] = 1;
    local_38 = 0;
  }
  else {
    __ptr = malloc(0x400);
    __ptr_00 = malloc(0x40000);
    if ((__ptr == (void *)0x0) || (__ptr_00 == (void *)0x0)) {
      local_38 = -2;
    }
    else {
      sort_typeBstar(in_stack_00000040,in_stack_00000038,in_stack_00000030,(int *)T,SA._4_4_,(int)SA
                    );
      construct_SA((uchar *)bucket_A,bucket_B,_err,
                   (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                   (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
    }
    free(__ptr_00);
    free(__ptr);
  }
  return local_38;
}

Assistant:

int
divsufsort(const unsigned char *T, int *SA, int n, int openMP) {
  int *bucket_A, *bucket_B;
  int m;
  int err = 0;

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) { return -1; }
  else if(n == 0) { return 0; }
  else if(n == 1) { SA[0] = 0; return 0; }
  else if(n == 2) { m = (T[0] < T[1]); SA[m ^ 1] = 0, SA[m] = 1; return 0; }

  bucket_A = (int *)malloc(BUCKET_A_SIZE * sizeof(int));
  bucket_B = (int *)malloc(BUCKET_B_SIZE * sizeof(int));

  /* Suffixsort. */
  if((bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, SA, bucket_A, bucket_B, n, openMP);
    construct_SA(T, SA, bucket_A, bucket_B, n, m);
  } else {
    err = -2;
  }

  free(bucket_B);
  free(bucket_A);

  return err;
}